

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validity_mask.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<int,int,int,duckdb::BinaryStandardOperatorWrapper,duckdb::SubtractOperator,bool,false,false>
               (int *ldata,int *rdata,int *result_data,idx_t count,ValidityMask *mask,bool fun)

{
  unsigned_long *puVar1;
  ulong uVar2;
  idx_t iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar1 == (unsigned_long *)0x0) {
    if (count != 0) {
      iVar3 = 0;
      do {
        result_data[iVar3] = ldata[iVar3] - rdata[iVar3];
        iVar3 = iVar3 + 1;
      } while (count != iVar3);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar4 = 0;
    uVar5 = 0;
    do {
      uVar2 = puVar1[uVar4];
      uVar7 = uVar5 + 0x40;
      if (count <= uVar5 + 0x40) {
        uVar7 = count;
      }
      uVar6 = uVar7;
      if (uVar2 != 0) {
        uVar6 = uVar5;
        if (uVar2 == 0xffffffffffffffff) {
          if (uVar5 < uVar7) {
            do {
              result_data[uVar5] = ldata[uVar5] - rdata[uVar5];
              uVar5 = uVar5 + 1;
              uVar6 = uVar7;
            } while (uVar7 != uVar5);
          }
        }
        else if (uVar5 < uVar7) {
          uVar8 = 0;
          do {
            if ((uVar2 >> (uVar8 & 0x3f) & 1) != 0) {
              result_data[uVar5 + uVar8] = ldata[uVar5 + uVar8] - rdata[uVar5 + uVar8];
            }
            uVar8 = uVar8 + 1;
            uVar6 = uVar7;
          } while (uVar7 - uVar5 != uVar8);
        }
      }
      uVar4 = uVar4 + 1;
      uVar5 = uVar6;
    } while (uVar4 != count + 0x3f >> 6);
    return;
  }
  return;
}

Assistant:

inline bool AllValid() const {
		return !validity_mask;
	}